

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DeleteReturning(sqlite3 *db,void *pArg)

{
  sqlite3HashInsert(&(db->aDb[1].pSchema)->trigHash,(char *)((long)pArg + 0xc4),(void *)0x0);
  if (*(ExprList **)((long)pArg + 8) != (ExprList *)0x0) {
    exprListDeleteNN(db,*(ExprList **)((long)pArg + 8));
  }
  sqlite3DbFreeNN(db,pArg);
  return;
}

Assistant:

static void sqlite3DeleteReturning(sqlite3 *db, void *pArg){
  Returning *pRet = (Returning*)pArg;
  Hash *pHash;
  pHash = &(db->aDb[1].pSchema->trigHash);
  sqlite3HashInsert(pHash, pRet->zName, 0);
  sqlite3ExprListDelete(db, pRet->pReturnEL);
  sqlite3DbFree(db, pRet);
}